

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.h
# Opt level: O0

int av1_filter_intra_allowed(AV1_COMMON *cm,MB_MODE_INFO *mbmi)

{
  int iVar1;
  BLOCK_SIZE *in_RSI;
  AV1_COMMON *in_RDI;
  bool local_11;
  
  local_11 = false;
  if ((in_RSI[2] == BLOCK_4X4) && (local_11 = false, in_RSI[0x8e] == BLOCK_4X4)) {
    iVar1 = av1_filter_intra_allowed_bsize(in_RDI,*in_RSI);
    local_11 = iVar1 != 0;
  }
  return (int)local_11;
}

Assistant:

static inline int av1_filter_intra_allowed(const AV1_COMMON *const cm,
                                           const MB_MODE_INFO *mbmi) {
  return mbmi->mode == DC_PRED &&
         mbmi->palette_mode_info.palette_size[0] == 0 &&
         av1_filter_intra_allowed_bsize(cm, mbmi->bsize);
}